

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::SegmentInfo::set_muxing_app(SegmentInfo *this,char *app)

{
  size_t sVar1;
  char *__dest;
  char *temp_str;
  size_t length;
  char *app_local;
  SegmentInfo *this_local;
  
  if (app != (char *)0x0) {
    sVar1 = strlen(app);
    __dest = (char *)operator_new__(sVar1 + 1,(nothrow_t *)&std::nothrow);
    if (__dest != (char *)0x0) {
      strcpy(__dest,app);
      if (this->muxing_app_ != (char *)0x0) {
        operator_delete__(this->muxing_app_);
      }
      this->muxing_app_ = __dest;
    }
  }
  return;
}

Assistant:

void SegmentInfo::set_muxing_app(const char* app) {
  if (app) {
    const size_t length = strlen(app) + 1;
    char* temp_str = new (std::nothrow) char[length];  // NOLINT
    if (!temp_str)
      return;

#ifdef _MSC_VER
    strcpy_s(temp_str, length, app);
#else
    strcpy(temp_str, app);
#endif

    delete[] muxing_app_;
    muxing_app_ = temp_str;
  }
}